

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

void gauden_norm_wt_mmie_var
               (vector_t ***in_var,vector_t ***wt_var,vector_t ***wt_num_var,vector_t ***wt_den_var,
               float32 ***num_dnom,float32 ***den_dnom,vector_t ***in_mean,vector_t ***wt_mean,
               vector_t ***wt_num_mean,vector_t ***wt_den_mean,uint32 n_mgau,uint32 n_feat,
               uint32 n_density,uint32 *veclen,float32 constE)

{
  uint uVar1;
  vector_t pfVar2;
  vector_t pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float32 fVar8;
  float fVar9;
  
  if (n_mgau != 0) {
    uVar7 = 0;
    do {
      if (n_feat != 0) {
        uVar5 = 0;
        do {
          if (n_density != 0) {
            uVar6 = 0;
            do {
              fVar9 = (float)num_dnom[uVar7][uVar5][uVar6];
              if ((((fVar9 != 0.0) || (NAN(fVar9))) || ((float)den_dnom[uVar7][uVar5][uVar6] != 0.0)
                  ) || (NAN((float)den_dnom[uVar7][uVar5][uVar6]))) {
                fVar8 = cal_constD(in_mean[uVar7][uVar5][uVar6],wt_num_mean[uVar7][uVar5][uVar6],
                                   wt_den_mean[uVar7][uVar5][uVar6],in_var[uVar7][uVar5][uVar6],
                                   wt_num_var[uVar7][uVar5][uVar6],wt_den_var[uVar7][uVar5][uVar6],
                                   (float32)fVar9,den_dnom[uVar7][uVar5][uVar6],veclen[uVar5],constE
                                  );
                if ((uint)ABS((float)fVar8) < 0x7f800000) {
                  if (veclen[uVar5] != 0) {
                    uVar4 = 0;
                    do {
                      fVar9 = ((in_mean[uVar7][uVar5][uVar6][uVar4] *
                                in_mean[uVar7][uVar5][uVar6][uVar4] +
                               in_var[uVar7][uVar5][uVar6][uVar4]) * (float)fVar8 +
                              (wt_num_var[uVar7][uVar5][uVar6][uVar4] -
                              wt_den_var[uVar7][uVar5][uVar6][uVar4])) /
                              (((float)num_dnom[uVar7][uVar5][uVar6] -
                               (float)den_dnom[uVar7][uVar5][uVar6]) + (float)fVar8) -
                              wt_mean[uVar7][uVar5][uVar6][uVar4] *
                              wt_mean[uVar7][uVar5][uVar6][uVar4];
                      wt_var[uVar7][uVar5][uVar6][uVar4] = fVar9;
                      if ((uint)ABS(fVar9) < 0x7f800000) {
                        if (fVar9 < 0.0) {
                          err_msg(ERR_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                  ,0x870,
                                  "Variance of the senone (mgau= %u, feat= %u, density=%u, component=%u) < 0\n"
                                  ,uVar7 & 0xffffffff,uVar5 & 0xffffffff,uVar6,uVar4);
                          goto LAB_00112fa8;
                        }
                      }
                      else {
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x869,
                                "The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n"
                                ,SUB84((double)fVar9,0),uVar7 & 0xffffffff,uVar5 & 0xffffffff,uVar6,
                                uVar4);
LAB_00112fa8:
                        wt_var[uVar7][uVar5][uVar6][uVar4] = in_var[uVar7][uVar5][uVar6][uVar4];
                      }
                      uVar4 = uVar4 + 1;
                    } while (uVar4 < veclen[uVar5]);
                  }
                }
                else {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x85b,
                          "Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n"
                          ,SUB84((double)(float)fVar8,0),uVar7 & 0xffffffff,uVar5 & 0xffffffff,uVar6
                         );
                  uVar1 = veclen[uVar5];
                  if ((ulong)uVar1 != 0) {
                    pfVar2 = in_var[uVar7][uVar5][uVar6];
                    pfVar3 = wt_var[uVar7][uVar5][uVar6];
                    uVar4 = 0;
                    do {
                      pfVar3[uVar4] = pfVar2[uVar4];
                      uVar4 = uVar4 + 1;
                    } while (uVar1 != uVar4);
                  }
                }
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 != n_density);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != n_feat);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != n_mgau);
  }
  return;
}

Assistant:

void
gauden_norm_wt_mmie_var(vector_t ***in_var,
			vector_t ***wt_var,
			vector_t ***wt_num_var,
			vector_t ***wt_den_var,
			float32 ***num_dnom,
			float32 ***den_dnom,
			vector_t ***in_mean,
			vector_t ***wt_mean,
			vector_t ***wt_num_mean,
			vector_t ***wt_den_mean,
			uint32 n_mgau,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen,
			float32 constE)
{
    uint32 i, j, k, l;
    float32 d_mmi = 0.0;
    
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (num_dnom[i][j][k] != 0 || den_dnom[i][j][k] != 0) {
		        
		    /* compute constant D, which controls the convergence speed and accuracy */
		    d_mmi = cal_constD(in_mean[i][j][k], wt_num_mean[i][j][k], wt_den_mean[i][j][k],
				       in_var[i][j][k], wt_num_var[i][j][k], wt_den_var[i][j][k], num_dnom[i][j][k], den_dnom[i][j][k], veclen[j], constE);
		    if (!finite(d_mmi)) {
			E_ERROR("Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n", d_mmi, i, j, k);
    			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
    			}
			continue;
		    }
		        
		    /* update variance parameters */
		    for (l = 0; l < veclen[j]; l++) {
			wt_var[i][j][k][l] = ((wt_num_var[i][j][k][l] - wt_den_var[i][j][k][l]) + 
					      d_mmi * (in_var[i][j][k][l] + in_mean[i][j][k][l] * in_mean[i][j][k][l])) / 
			    (num_dnom[i][j][k] - den_dnom[i][j][k] + d_mmi)
			    - (wt_mean[i][j][k][l] * wt_mean[i][j][k][l]);
			if (!finite(wt_var[i][j][k][l])) {
			    E_ERROR("The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n", wt_var[i][j][k][l], i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			    continue;
			}
			
			/* if the new var<0, keep it unchanged */
			if (wt_var[i][j][k][l] < 0) {
			    E_ERROR("Variance of the senone (mgau= %u, feat= %u, ""density=%u, component=%u) < 0\n", i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}